

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

ImageChannelDesc * __thiscall
pbrt::Image::GetChannelDesc
          (ImageChannelDesc *__return_storage_ptr__,Image *this,
          span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          requestedChannels)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_t sVar2;
  size_t __n;
  int iVar3;
  memory_resource *pmVar4;
  size_type n;
  size_t sVar5;
  size_t sVar6;
  size_type *psVar7;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar8;
  ulong uVar9;
  bool bVar10;
  ImageChannelDesc desc;
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> local_60;
  
  n = requestedChannels.n;
  local_60.alloc.memoryResource = pstd::pmr::new_delete_resource();
  local_60.ptr = (int *)0x0;
  local_60.nAlloc = 0;
  local_60.nStored = 0;
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::resize(&local_60,n);
  bVar10 = n != 0;
  if (bVar10) {
    pbVar1 = (this->channelNames).ptr;
    sVar2 = (this->channelNames).nStored;
    paVar8 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
              *)local_60.ptr;
    if ((anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
         *)local_60.ptr ==
        (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
         *)0x0) {
      paVar8 = &local_60.field_2;
    }
    uVar9 = 0;
    do {
      if (sVar2 == 0) {
        sVar6 = 0;
      }
      else {
        __n = requestedChannels.ptr[uVar9]._M_string_length;
        sVar5 = 0;
        psVar7 = &pbVar1->_M_string_length;
        do {
          if ((__n == *psVar7) &&
             ((__n == 0 ||
              (iVar3 = bcmp(requestedChannels.ptr[uVar9]._M_dataplus._M_p,
                            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (psVar7 + -1))->_M_dataplus)._M_p,__n), iVar3 == 0)))) {
            paVar8->fixed[uVar9] = (int)sVar5;
            sVar6 = sVar5;
            break;
          }
          sVar5 = sVar5 + 1;
          psVar7 = psVar7 + 4;
          sVar6 = sVar2;
        } while (sVar2 != sVar5);
      }
      if (sVar6 == sVar2) {
        pmVar4 = pstd::pmr::new_delete_resource();
        (__return_storage_ptr__->offset).alloc.memoryResource = pmVar4;
        (__return_storage_ptr__->offset).ptr = (int *)0x0;
        (__return_storage_ptr__->offset).nAlloc = 0;
        (__return_storage_ptr__->offset).nStored = 0;
        if (bVar10) goto LAB_0023cbc4;
        break;
      }
      uVar9 = uVar9 + 1;
      bVar10 = uVar9 < n;
    } while (uVar9 != n);
  }
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::InlinedVector
            (&__return_storage_ptr__->offset,&local_60);
LAB_0023cbc4:
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector(&local_60);
  return __return_storage_ptr__;
}

Assistant:

ImageChannelDesc Image::GetChannelDesc(
    pstd::span<const std::string> requestedChannels) const {
    ImageChannelDesc desc;
    desc.offset.resize(requestedChannels.size());
    for (size_t i = 0; i < requestedChannels.size(); ++i) {
        size_t j;
        for (j = 0; j < channelNames.size(); ++j)
            if (requestedChannels[i] == channelNames[j]) {
                desc.offset[i] = j;
                break;
            }
        if (j == channelNames.size())
            return {};
    }

    return desc;
}